

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

Matrix3d *
Util::Angle2RotM(Matrix3d *__return_storage_ptr__,Vector3d *angles,
                vector<int,_std::allocator<int>_> *order)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int ii;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Matrix3d R;
  type tmp;
  double local_108;
  double dStack_100;
  double local_e8 [2];
  Matrix3d local_d8;
  double local_88 [6];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  lVar6 = 0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  local_88[0] = 0.0;
  local_88[1] = 1.0;
  do {
    iVar2 = (order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    if (iVar2 == 3) {
      dVar11 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[lVar6]);
      dVar10 = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[lVar6]);
      dStack_100 = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[lVar6]);
      dStack_100 = -dStack_100;
      dVar7 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[lVar6]);
LAB_0010f5d5:
      dVar8 = 1.0;
      dVar9 = 0.0;
      local_108 = 0.0;
      dVar12 = 0.0;
      dVar13 = 0.0;
    }
    else if (iVar2 == 2) {
      dVar11 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[lVar6]);
      local_e8[0] = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[lVar6]);
      local_e8[0] = -local_e8[0];
      local_e8[1] = 0.0;
      dVar9 = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[lVar6]);
      dVar8 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[lVar6]);
      dStack_100 = 0.0;
      local_108 = 0.0;
      dVar10 = local_88[0];
      dVar7 = local_88[1];
      dVar12 = local_e8[0];
      dVar13 = local_e8[1];
    }
    else {
      if (iVar2 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: Bad Angle Selection!",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        dVar10 = 0.0;
        dVar7 = 1.0;
        dVar11 = 1.0;
        dStack_100 = 0.0;
        goto LAB_0010f5d5;
      }
      dVar7 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[lVar6]);
      local_e8[1] = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[lVar6]);
      local_e8[0] = 0.0;
      local_108 = sin((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[lVar6]);
      local_108 = -local_108;
      dVar8 = cos((angles->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[lVar6]);
      dVar9 = 0.0;
      dVar11 = 1.0;
      dStack_100 = 0.0;
      dVar10 = 0.0;
      dVar12 = local_e8[0];
      dVar13 = local_e8[1];
    }
    lVar5 = 0x10;
    do {
      dVar1 = *(double *)
               ((long)local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar5);
      dVar3 = *(double *)((long)local_e8 + lVar5);
      dVar4 = *(double *)((long)local_e8 + lVar5 + 8);
      *(double *)((long)local_88 + lVar5) = dVar4 * dVar10 + dVar3 * dVar11 + dVar1 * dVar12;
      *(double *)((long)local_88 + lVar5 + 8) = dVar4 * dVar7 + dVar3 * dStack_100 + dVar1 * dVar13;
      *(double *)((long)local_88 + lVar5 + 0x10) = local_108 * dVar4 + dVar1 * dVar8 + dVar9 * dVar3
      ;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x58);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = local_88[2];
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = local_88[3];
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = local_88[4];
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = local_88[5];
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = local_58;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = dStack_50;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = local_48;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = dStack_40;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = local_38;
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      OrthoNormMat(&local_d8);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Eigen::Matrix3d Angle2RotM(Eigen::Vector3d angles, std::vector<int> order){

		//initialize matrix
		Eigen::Matrix3d R = Eigen::Matrix3d::Identity(3,3);

		for (int ii = 0; ii < 3; ++ii){
			
			//iteration matrix
			Eigen::Matrix3d R_iter = Eigen::Matrix3d::Identity(3,3);

			//switch case
			switch(order[ii]) {
				case 1 : {
					R_iter(1,1) = cos(angles[ii]);
					R_iter(1,2) = sin(angles[ii]);
					R_iter(2,1) = -sin(angles[ii]);
					R_iter(2,2) = cos(angles[ii]);
					break;
				} case 2 : {
					R_iter(0,0) = cos(angles[ii]);
					R_iter(0,2) = -sin(angles[ii]);
					R_iter(2,0) = sin(angles[ii]);
					R_iter(2,2) = cos(angles[ii]);
					break;
				} case 3 : {
					R_iter(0,0) = cos(angles[ii]);
					R_iter(0,1) = sin(angles[ii]);
					R_iter(1,0) = -sin(angles[ii]);
					R_iter(1,1) = cos(angles[ii]);
					break;
				} default : {
					std::cout << "Error: Bad Angle Selection!" << std::endl;
				}
			} // switch

			//multiply
			R = R_iter*R;

		} // for

		//output
		return OrthoNormMat(R); // not super sure if this should actually be R.transpose()

	}